

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O2

pboolean p_tree_bst_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                          pconstpointer key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  PTreeBaseNode *pPVar4;
  pint pVar5;
  PTreeBaseNode *pPVar6;
  PTreeBaseNode *pPVar7;
  PTreeBaseNode *pPVar8;
  
  while( true ) {
    do {
      pPVar8 = (PTreeBaseNode *)root_node;
      root_node = &pPVar8->left->left;
      if ((PTreeBaseNode *)root_node == (PTreeBaseNode *)0x0) {
        return 0;
      }
      pVar5 = (*compare_func)(key,((PTreeBaseNode *)root_node)->key,data);
    } while (pVar5 < 0);
    if (pVar5 == 0) break;
    root_node = &((PTreeBaseNode *)root_node)->right;
  }
  pPVar7 = ((PTreeBaseNode *)root_node)->left;
  if (pPVar7 != (PTreeBaseNode *)0x0) {
    pPVar4 = (PTreeBaseNode *)root_node;
    if (((PTreeBaseNode *)root_node)->right == (PTreeBaseNode_ *)0x0) goto LAB_00114238;
    do {
      pPVar8 = pPVar4;
      pPVar6 = pPVar7;
      pPVar7 = pPVar6->right;
      pPVar4 = (PTreeBaseNode *)&pPVar6->right;
    } while (pPVar6->right != (PTreeBaseNode_ *)0x0);
    uVar1 = *(undefined4 *)((long)&pPVar6->key + 4);
    uVar2 = *(undefined4 *)&pPVar6->value;
    uVar3 = *(undefined4 *)((long)&pPVar6->value + 4);
    *(undefined4 *)&((PTreeBaseNode *)root_node)->key = *(undefined4 *)&pPVar6->key;
    *(undefined4 *)((long)&((PTreeBaseNode *)root_node)->key + 4) = uVar1;
    *(undefined4 *)&((PTreeBaseNode *)root_node)->value = uVar2;
    *(undefined4 *)((long)&((PTreeBaseNode *)root_node)->value + 4) = uVar3;
    pPVar7 = pPVar6->left;
    root_node = &pPVar6->left;
    if (pPVar7 != (PTreeBaseNode *)0x0) goto LAB_00114238;
  }
  pPVar7 = ((PTreeBaseNode *)root_node)->right;
LAB_00114238:
  pPVar8->left = pPVar7;
  if (key_destroy_func != (PDestroyFunc)0x0) {
    (*key_destroy_func)(((PTreeBaseNode *)root_node)->key);
  }
  if (value_destroy_func != (PDestroyFunc)0x0) {
    (*value_destroy_func)(((PTreeBaseNode *)root_node)->value);
  }
  p_free(root_node);
  return 1;
}

Assistant:

pboolean
p_tree_bst_remove (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	**node_pointer;
	pint		cmp_result;

	cur_node     = *root_node;
	node_pointer = root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0) {
			node_pointer = &cur_node->left;
			cur_node     = cur_node->left;
		} else if (cmp_result > 0) {
			node_pointer = &cur_node->right;
			cur_node     = cur_node->right;
		} else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		node_pointer = &cur_node->left;
		prev_node    = cur_node->left;

		while (prev_node->right != NULL) {
			node_pointer = &prev_node->right;
			prev_node    = prev_node->right;
		}

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		cur_node = prev_node;
	}

	*node_pointer = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}